

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_stream_parser.cc
# Opt level: O1

Status * __thiscall
google::protobuf::util::converter::JsonStreamParser::ReportUnknown
          (Status *__return_storage_ptr__,JsonStreamParser *this,StringPiece message)

{
  StringPiece message_00;
  char *local_a8;
  undefined8 local_a0;
  AlphaNum local_78;
  string local_48;
  
  local_78.piece_size_ = message.length_;
  local_78.piece_data_ = message.ptr_;
  if (this->finishing_ == false) {
    Status::Status(__return_storage_ptr__,CANCELLED,(StringPiece)ZEXT816(0x352cac));
  }
  else if ((this->p_).length_ == 0) {
    local_a8 = "Unexpected end of string. ";
    local_a0 = 0x1a;
    StrCat_abi_cxx11_(&local_48,(protobuf *)&local_a8,&local_78,(AlphaNum *)local_78.piece_size_);
    message_00.length_ = local_48._M_string_length;
    message_00.ptr_ = local_48._M_dataplus._M_p;
    if ((long)local_48._M_string_length < 0) {
      StringPiece::LogFatalSizeTooBig(local_48._M_string_length,"size_t to int conversion");
    }
    ReportFailure(__return_storage_ptr__,this,message_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  else {
    ReportFailure(__return_storage_ptr__,this,message);
  }
  return __return_storage_ptr__;
}

Assistant:

util::Status JsonStreamParser::ReportUnknown(StringPiece message) {
  // If we aren't finishing the parse, cancel parsing and try later.
  if (!finishing_) {
    return util::Status(util::error::CANCELLED, "");
  }
  if (p_.empty()) {
    return ReportFailure(StrCat("Unexpected end of string. ", message));
  }
  return ReportFailure(message);
}